

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O2

void __thiscall sjtu::UserManager::add_user(UserManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar1;
  UserManager *pUVar2;
  size_type *psVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar6;
  ostream *poVar7;
  undefined4 extraout_var_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int i;
  long lVar8;
  string *psVar9;
  char *__dest;
  int i_1;
  pair<long,_bool> pVar10;
  allocator local_191;
  char *local_190;
  UserManager *local_188;
  size_type *local_180;
  char *local_178;
  string usname;
  value_type local_150;
  long local_140;
  undefined1 local_138;
  string uspass;
  string current;
  string umail;
  string uname;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_188 = this;
  if (this->UserBpTree->root == -1) {
    iVar5 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[1])();
    pcVar6 = (char *)CONCAT44(extraout_var_01,iVar5);
    local_180 = (size_type *)(pcVar6 + 0x78);
    *(undefined8 *)(pcVar6 + 0x78) = extraout_RDX_00;
    pcVar6[0x68] = '\n';
    pcVar6[0x69] = '\0';
    pcVar6[0x6a] = '\0';
    pcVar6[0x6b] = '\0';
    local_178 = pcVar6 + 0x49;
    local_190 = pcVar6 + 0x34;
    for (lVar8 = 0; psVar3 = local_180, pUVar2 = local_188, lVar8 < argc; lVar8 = lVar8 + 2) {
      bVar4 = std::operator==(argv,"-u");
      __dest = pcVar6;
      if ((((bVar4) || (bVar4 = std::operator==(argv,"-p"), __dest = pcVar6 + 0x15, bVar4)) ||
          (bVar4 = std::operator==(argv,"-n"), __dest = local_190, bVar4)) ||
         (bVar4 = std::operator==(argv,"-m"), __dest = local_178, bVar4)) {
        strcpy(__dest,argv[1]._M_dataplus._M_p);
      }
      argv = argv + 2;
    }
    pcVar6[0x6c] = '\0';
    pcVar6[0x6d] = '\0';
    pcVar6[0x6e] = '\0';
    pcVar6[0x6f] = '\0';
    (*(local_188->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
              (local_188->UserFile,local_180);
    pBVar1 = pUVar2->UserBpTree;
    std::__cxx11::string::string((string *)&local_50,pcVar6,(allocator *)&uspass);
    usname._M_dataplus._M_p = (pointer)StringHasher::operator()((StringHasher *)pUVar2,&local_50);
    usname._M_string_length = *psVar3;
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
              (pBVar1,(value_type *)&usname);
    std::__cxx11::string::~string((string *)&local_50);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
    std::endl<char,std::char_traits<char>>(poVar7);
    return;
  }
  usname._M_dataplus._M_p = (pointer)&usname.field_2;
  usname._M_string_length = 0;
  uspass._M_dataplus._M_p = (pointer)&uspass.field_2;
  uspass._M_string_length = 0;
  usname.field_2._M_local_buf[0] = '\0';
  uspass.field_2._M_local_buf[0] = '\0';
  uname._M_dataplus._M_p = (pointer)&uname.field_2;
  uname._M_string_length = 0;
  umail._M_dataplus._M_p = (pointer)&umail.field_2;
  umail._M_string_length = 0;
  uname.field_2._M_local_buf[0] = '\0';
  umail.field_2._M_local_buf[0] = '\0';
  current._M_dataplus._M_p = (pointer)&current.field_2;
  current._M_string_length = 0;
  current.field_2._M_local_buf[0] = '\0';
  for (lVar8 = 0; pUVar2 = local_188, lVar8 < argc; lVar8 = lVar8 + 2) {
    bVar4 = std::operator==(argv,"-u");
    psVar9 = &usname;
    if ((bVar4) || (bVar4 = std::operator==(argv,"-p"), psVar9 = &uspass, bVar4)) {
LAB_00103cd0:
      std::__cxx11::string::_M_assign((string *)psVar9);
    }
    else {
      bVar4 = std::operator==(argv,"-n");
      psVar9 = &uname;
      if (bVar4) goto LAB_00103cd0;
      bVar4 = std::operator==(argv,"-m");
      psVar9 = &umail;
      if (bVar4) goto LAB_00103cd0;
      bVar4 = std::operator==(argv,"-c");
      psVar9 = &current;
      if (bVar4) goto LAB_00103cd0;
      bVar4 = std::operator==(argv,"-g");
      if (bVar4) {
        iVar5 = std::__cxx11::stoi(argv + 1,(size_t *)0x0,10);
        local_190 = (char *)CONCAT44(local_190._4_4_,iVar5);
      }
    }
    argv = argv + 2;
  }
  pBVar1 = local_188->UserBpTree;
  std::__cxx11::string::string((string *)&local_70,(string *)&current);
  local_150.first = StringHasher::operator()((StringHasher *)pUVar2,&local_70);
  pVar10 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar1,&local_150.first);
  local_140 = pVar10.first;
  local_138 = pVar10.second;
  std::__cxx11::string::~string((string *)&local_70);
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    iVar5 = (*(pUVar2->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                      (pUVar2->UserFile,&local_140);
    if ((*(uint *)(CONCAT44(extraout_var,iVar5) + 0x6c) == pUVar2->online_flag) &&
       ((int)local_190 < *(int *)(CONCAT44(extraout_var,iVar5) + 0x68))) {
      pBVar1 = pUVar2->UserBpTree;
      std::__cxx11::string::string((string *)&local_90,(string *)&usname);
      local_150.first = StringHasher::operator()((StringHasher *)pUVar2,&local_90);
      pVar10 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                         (pBVar1,&local_150.first);
      std::__cxx11::string::~string((string *)&local_90);
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        iVar5 = (*(pUVar2->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base
                  [1])();
        pcVar6 = (char *)CONCAT44(extraout_var_00,iVar5);
        *(undefined8 *)(pcVar6 + 0x78) = extraout_RDX;
        strcpy(pcVar6,usname._M_dataplus._M_p);
        strcpy(pcVar6 + 0x15,uspass._M_dataplus._M_p);
        strcpy(pcVar6 + 0x34,uname._M_dataplus._M_p);
        strcpy(pcVar6 + 0x49,umail._M_dataplus._M_p);
        *(int *)(pcVar6 + 0x68) = (int)local_190;
        pcVar6[0x6c] = '\0';
        pcVar6[0x6d] = '\0';
        pcVar6[0x6e] = '\0';
        pcVar6[0x6f] = '\0';
        (*(pUVar2->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
                  (pUVar2->UserFile,pcVar6 + 0x78);
        pBVar1 = pUVar2->UserBpTree;
        std::__cxx11::string::string((string *)&local_b0,pcVar6,&local_191);
        local_150.first = StringHasher::operator()((StringHasher *)pUVar2,&local_b0);
        local_150.second = *(long *)(pcVar6 + 0x78);
        BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
                  (pBVar1,&local_150);
        std::__cxx11::string::~string((string *)&local_b0);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
        std::endl<char,std::char_traits<char>>(poVar7);
        goto LAB_00104026;
      }
    }
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
LAB_00104026:
  std::__cxx11::string::~string((string *)&current);
  std::__cxx11::string::~string((string *)&umail);
  std::__cxx11::string::~string((string *)&uname);
  std::__cxx11::string::~string((string *)&uspass);
  std::__cxx11::string::~string((string *)&usname);
  return;
}

Assistant:

void add_user(int argc, std::string *argv) {
            if (UserBpTree->empty()) {
                auto ret = UserFile->newspace();
                userType *user = ret.first;
                user->offset = ret.second;
                user->privilege = 10;
                for (int i = 0; i < argc; i += 2) {
                    if (argv[i] == "-u") strcpy(user->username, argv[i + 1].c_str());
                    else if (argv[i] == "-p") strcpy(user->password, argv[i + 1].c_str());
                    else if (argv[i] == "-n") strcpy(user->name, argv[i + 1].c_str());
                    else if (argv[i] == "-m") strcpy(user->mailAddr, argv[i + 1].c_str());
                }
                user->is_online = 0;
                UserFile->save(user->offset);
                UserBpTree->insert(BplusTree<StringHasher::hashType , locType>::value_type(hasher(user->username), user->offset));
                std::cout << 0 << std::endl;
            } else {
                std::string usname, uspass, uname, umail, current;
                int upri;
                for (int i = 0; i < argc; i += 2) {
                    if (argv[i] == "-u") usname = argv[i + 1];
                    else if (argv[i] == "-p") uspass = argv[i + 1];
                    else if (argv[i] == "-n") uname = argv[i + 1];
                    else if (argv[i] == "-m") umail = argv[i + 1];
                    else if (argv[i] == "-c") current = argv[i + 1];
                    else if (argv[i] == "-g") upri = stoi(argv[i + 1]);
                }
                std::pair<locType, bool> tmp = UserBpTree->find(hasher(current));
                if (tmp.second)
		{
			userType *curuser = UserFile->read(tmp.first);
			if (curuser -> is_online == online_flag && curuser->privilege > upri && UserBpTree -> find(hasher(usname)).second == false)
			{
				auto ret = UserFile -> newspace();
				userType *user = ret . first;
				user -> offset = ret . second;
				strcpy(user -> username , usname . c_str());
				strcpy(user -> password , uspass . c_str());
				strcpy(user -> name , uname . c_str());
				strcpy(user -> mailAddr , umail . c_str());
				user -> privilege = upri;
				user -> is_online = 0;
				UserFile -> save(user -> offset);
				UserBpTree -> insert(BplusTree<StringHasher::hashType , locType>::value_type(
					hasher(user -> username) , user -> offset));
				std::cout << 0 << std::endl;
			}else std::cout << -1 << std::endl;
                } else std::cout << -1 << std::endl;
            }
        }